

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O2

int demo1(void)

{
  uint uVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  allocator_type local_479;
  string input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> charvect;
  vector<unsigned_char,_std::allocator<unsigned_char>_> charvectslice;
  CyclicHash<unsigned_int,_unsigned_char> hf;
  
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash(&hf,3,0x20);
  std::__cxx11::string::string((string *)&input,"ABCD",(allocator *)&charvectslice);
  CyclicHash<unsigned_int,_unsigned_char>::eat(&hf,input._M_dataplus._M_p[1]);
  CyclicHash<unsigned_int,_unsigned_char>::eat(&hf,input._M_dataplus._M_p[2]);
  CyclicHash<unsigned_int,_unsigned_char>::eat(&hf,input._M_dataplus._M_p[3]);
  poVar2 = std::operator<<((ostream *)&std::cout,"Hash value of BCD is ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&charvectslice,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(input._M_dataplus._M_p + 1),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(input._M_dataplus._M_p + 4),(allocator_type *)&charvect);
  uVar1 = CyclicHash<unsigned_int,unsigned_char>::
          hash<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
                    ((CyclicHash<unsigned_int,unsigned_char> *)&hf,&charvectslice);
  if (uVar1 != hf.hashvalue) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"bug");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  CyclicHash<unsigned_int,_unsigned_char>::reverse_update
            (&hf,*input._M_dataplus._M_p,input._M_dataplus._M_p[3]);
  poVar2 = std::operator<<((ostream *)&std::cout,"Hash value of ABC is ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&charvect,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )input._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(input._M_dataplus._M_p + 3),&local_479);
  uVar1 = CyclicHash<unsigned_int,unsigned_char>::
          hash<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
                    ((CyclicHash<unsigned_int,unsigned_char> *)&hf,&charvect);
  if (uVar1 == hf.hashvalue) {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&charvect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&charvectslice.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::__cxx11::string::~string((string *)&input);
    return 0;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"bug");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int demo1() {
  CyclicHash<> hf(3, 32);
  string input = "ABCD";
  hf.eat(input[1]); // B
  hf.eat(input[2]); // C
  hf.eat(input[3]); // D
  cout << "Hash value of BCD is " << hf.hashvalue << endl;
  // we check the answer going the long way...
  const std::vector<unsigned char> charvectslice(input.begin() + 1,
                                                 input.begin() + 4);
  uint32_t trueanswerslice = hf.hash(charvectslice);
  if (trueanswerslice != hf.hashvalue)
    throw runtime_error("bug");
  // we continue
  hf.reverse_update(input[0], input[3]); // remove D, prepend A
  cout << "Hash value of ABC is " << hf.hashvalue << endl;
  // we check the answer going the long way
  const std::vector<unsigned char> charvect(input.begin(), input.begin() + 3);
  uint32_t trueanswer = hf.hash(charvect);
  if (trueanswer != hf.hashvalue)
    throw runtime_error("bug");
  return 0;
}